

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data.cpp
# Opt level: O1

clock_t Data::times(tms *__buffer)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  clock_t cVar4;
  vector<Data_*,_std::allocator<Data_*>_> *__range1;
  long *plVar5;
  
  if (*(long *)__buffer->tms_utime == 0) {
    cVar4 = 0;
  }
  else {
    cVar4 = 0;
    lVar3 = __dynamic_cast(*(long *)__buffer->tms_utime,&typeinfo,&Integer::typeinfo,0);
    if (lVar3 != 0) {
      cVar4 = Integer::times(__buffer);
    }
  }
  plVar1 = (long *)__buffer->tms_stime;
  for (plVar5 = (long *)__buffer->tms_utime; plVar5 != plVar1; plVar5 = plVar5 + 1) {
    plVar2 = (long *)*plVar5;
    if ((plVar2 != (long *)0x0) && ((int)plVar2[1] == 0)) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  if ((void *)__buffer->tms_utime != (void *)0x0) {
    operator_delete((void *)__buffer->tms_utime);
  }
  operator_delete(__buffer);
  return cVar4;
}

Assistant:

Data *Data::times(std::vector<Data *> *dataPara) {
    Data *result = NULL;
    if ((dynamic_cast<Integer *>((*dataPara)[0])) != NULL) {
        result = Integer::times(dataPara);
    }
    for (auto i: *dataPara) {
        Data::check(i);
    }
    delete dataPara;
    return result;
}